

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDataStream.cpp
# Opt level: O0

KDataStream * __thiscall KDIS::KDataStream::operator<<(KDataStream *this,KDataStream *val)

{
  bool bVar1;
  reference __x;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_38;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_30;
  const_iterator citrEnd;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_20;
  const_iterator citr;
  KDataStream *val_local;
  KDataStream *this_local;
  
  citr._M_current = (uchar *)val;
  citrEnd._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&val->m_vBuffer);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_20,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)&citrEnd);
  local_38._M_current =
       (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(&val->m_vBuffer);
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)&local_30,&local_38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_30);
    if (!bVar1) break;
    __x = __gnu_cxx::
          __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator*(&local_20);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&this->m_vBuffer,__x);
    __gnu_cxx::
    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator++(&local_20);
  }
  return this;
}

Assistant:

KDataStream & KDataStream::operator << ( KDataStream val )
{
    vector<KUOCTET>::const_iterator citr = val.m_vBuffer.begin();
    vector<KUOCTET>::const_iterator citrEnd = val.m_vBuffer.end();

    // Copy data into the buffer OCTET by OCTET
    for( ; citr != citrEnd; ++citr )
    {
        m_vBuffer.push_back( *citr );
    }

    return *this;
}